

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  FieldDescriptor *pFVar1;
  uint32_t number;
  long lVar2;
  
  WriteUInt32ToUtf16CharSequence
            (*(uint32_t *)((this->super_ImmutableEnumFieldLiteGenerator).descriptor_ + 4),output);
  number = GetExperimentalJavaFieldType((this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  pFVar1 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  if (((byte)pFVar1[1] & 0x10) == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)(pFVar1 + 0x28);
  }
  WriteUInt32ToUtf16CharSequence
            ((int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x30)) >> 3) * -0x33333333,
             output);
  pFVar1 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  if (*(char *)(*(long *)(pFVar1 + 0x10) + 0x3a) == '\x03') {
    return;
  }
  PrintEnumVerifierLogic
            (printer,pFVar1,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,"$type$",",\n"
             ,(((this->super_ImmutableEnumFieldLiteGenerator).context_)->options_).enforce_lite);
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
  if (!SupportUnknownEnumValue(descriptor_)) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}